

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

int16_t target_pick(wchar_t y1,wchar_t x1,wchar_t dy,wchar_t dx,point_set *targets)

{
  uint uVar1;
  int16_t iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int local_38;
  int local_34;
  
  iVar3 = point_set_size((point_set_conflict *)targets);
  if (iVar3 < 1) {
    iVar2 = -1;
  }
  else {
    local_38 = -1;
    local_34 = 9999;
    lVar6 = 0;
    do {
      uVar5 = targets->pts[lVar6].x - x1;
      if (((dx == L'\0') || (0 < uVar5 * dx)) &&
         ((uVar4 = targets->pts[lVar6].y - y1, dy == L'\0' || (0 < uVar4 * dy)))) {
        uVar1 = -uVar5;
        if (0 < (int)uVar5) {
          uVar1 = uVar5;
        }
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        if ((uVar1 <= uVar5 || (dx != L'\0' || dy == L'\0')) &&
           (uVar5 <= uVar1 || (dx == L'\0' || dy != L'\0'))) {
          iVar3 = uVar1 + uVar5 * 2;
          if (uVar5 < uVar1) {
            iVar3 = uVar5 + uVar1 * 2;
          }
          if (iVar3 < local_34 || local_38 < 0) {
            local_38 = (int)lVar6;
            local_34 = iVar3;
          }
        }
      }
      lVar6 = lVar6 + 1;
      iVar3 = point_set_size((point_set_conflict *)targets);
    } while (lVar6 < iVar3);
    iVar2 = (int16_t)local_38;
  }
  return iVar2;
}

Assistant:

int16_t target_pick(int y1, int x1, int dy, int dx, struct point_set *targets)
{
	int i, v;

	int x2, y2, x3, y3, x4, y4;

	int b_i = -1, b_v = 9999;


	/* Scan the locations */
	for (i = 0; i < point_set_size(targets); i++) {
		/* Point 2 */
		x2 = targets->pts[i].x;
		y2 = targets->pts[i].y;

		/* Directed distance */
		x3 = (x2 - x1);
		y3 = (y2 - y1);

		/* Verify quadrant */
		if (dx && (x3 * dx <= 0)) continue;
		if (dy && (y3 * dy <= 0)) continue;

		/* Absolute distance */
		x4 = ABS(x3);
		y4 = ABS(y3);

		/* Verify quadrant */
		if (dy && !dx && (x4 > y4)) continue;
		if (dx && !dy && (y4 > x4)) continue;

		/* Approximate Double Distance */
		v = ((x4 > y4) ? (x4 + x4 + y4) : (y4 + y4 + x4));

		/* Track best */
		if ((b_i >= 0) && (v >= b_v)) continue;

		/* Track best */
		b_i = i; b_v = v;
	}

	/* Result */
	return (b_i);
}